

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void __thiscall IDLExport::adaptNamespace(IDLExport *this,ostream *stream,string *ns)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_namespace;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_namespace;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  __lhs = &this->m_namespace;
  bVar1 = std::operator!=(__lhs,ns);
  if (bVar1) {
    anon_unknown.dwarf_1aacf::nameSplit
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68,__lhs);
    anon_unknown.dwarf_1aacf::nameSplit
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_80,ns);
    while ((local_68._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_68
           && (local_80._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&local_80))) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_68._M_impl._M_node.super__List_node_base._M_next + 1),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_80._M_impl._M_node.super__List_node_base._M_next + 1));
      if (!_Var2) break;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_68);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_80);
    }
    closeNamespaces(this,stream,(int)local_68._M_impl._M_node._M_size);
    while (local_80._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_80) {
      poVar3 = std::operator<<(stream,(string *)&this->m_indent);
      poVar3 = std::operator<<(poVar3,"module ");
      anon_unknown.dwarf_1aacf::normalizeIDLName
                (&local_50,(string *)(local_80._M_impl._M_node.super__List_node_base._M_next + 1));
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      std::operator<<(poVar3," {\n");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((char *)&this->m_indent);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_80);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_80);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_68);
  }
  std::__cxx11::string::_M_assign((string *)__lhs);
  return;
}

Assistant:

void IDLExport::adaptNamespace(ostream& stream, string const& ns)
{
    if (m_namespace != ns)
    {
        list<string>
            old_namespace = nameSplit(m_namespace),
            new_namespace = nameSplit(ns);

        while(!old_namespace.empty() && !new_namespace.empty() && old_namespace.front() == new_namespace.front())
        {
            old_namespace.pop_front();
            new_namespace.pop_front();
        }

        closeNamespaces(stream, old_namespace.size());

        while (!new_namespace.empty())
        {
            stream << m_indent << "module " << normalizeIDLName(new_namespace.front()) << " {\n";
            m_indent += "    ";
            new_namespace.pop_front();
        }
    }
    m_namespace = ns;
}